

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem,realtype t,realtype s,int *nvec)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = *nvec;
  step_mem->cvals[iVar1] = s;
  step_mem->Xvecs[iVar1] = *step_mem->forcing;
  *nvec = iVar1 + 1;
  if (1 < step_mem->nforcing) {
    dVar3 = (t - step_mem->tshift) / step_mem->tscale;
    lVar2 = 1;
    dVar4 = dVar3;
    do {
      iVar1 = *nvec;
      step_mem->cvals[iVar1] = dVar4 * s;
      step_mem->Xvecs[iVar1] = step_mem->forcing[lVar2];
      *nvec = iVar1 + 1;
      lVar2 = lVar2 + 1;
      dVar4 = dVar3 * dVar4;
    } while (lVar2 < step_mem->nforcing);
  }
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, realtype t,
                          realtype s, int *nvec)
{
  realtype tau, taui;
  int i;

  /* always append the constant forcing term */
  step_mem->cvals[*nvec] = s;
  step_mem->Xvecs[*nvec] = step_mem->forcing[0];
  (*nvec) += 1;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - step_mem->tshift) / (step_mem->tscale);
  taui = tau;
  for (i=1; i<step_mem->nforcing; i++) {
    step_mem->cvals[*nvec] = s*taui;
    step_mem->Xvecs[*nvec] = step_mem->forcing[i];
    taui *= tau;
    (*nvec) += 1;
  }
}